

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * __thiscall lest::to_string_abi_cxx11_(string *__return_storage_ptr__,lest *this,char **txt)

{
  allocator local_71;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,*(char **)this,&local_71);
  make_tran_string(&local_70,&local_30);
  std::operator+(&local_50,"\"",&local_70);
  std::operator+(__return_storage_ptr__,&local_50,"\"");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( char const *   const & txt ) { return "\"" + make_tran_string(                 txt   ) + "\""; }